

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::printBasicInfo(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *this,ostream *os)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  uint uVar4;
  
  operator<<(os,(this->super_Node).type_);
  iVar1 = (*(this->super_Node)._vptr_Node[2])(this);
  if ((char)iVar1 != '\0') {
    poVar3 = std::operator<<(os,' ');
    operator<<(poVar3,&(this->nameAttribute_).attr_);
  }
  std::operator<<(os,'\n');
  uVar2 = (*(this->super_Node)._vptr_Node[4])(this);
  if (uVar2 == 0) {
    uVar2 = (*(this->super_Node)._vptr_Node[7])(this);
  }
  uVar4 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    poVar3 = std::operator<<(os,"name ");
    iVar1 = (*(this->super_Node)._vptr_Node[8])(this,(ulong)uVar4);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar1));
    std::operator<<(poVar3,'\n');
  }
  if (5 < (uint)((this->super_Node).type_ + ~AVRO_NULL)) {
    return;
  }
  poVar3 = std::operator<<(os,"end ");
  poVar3 = operator<<(poVar3,(this->super_Node).type_);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::printBasicInfo(std::ostream &os) const
{
    os << type();
    if(hasName()) {
        os << ' ' << nameAttribute_.get();
    }

    if(D::hasAttribute) {
        os << " " << sizeAttribute_.get();
    }
    os << '\n';
    int count = leaves();
    count = count ? count : names();
    for(int i= 0; i < count; ++i) {
        if( C::hasAttribute ) {
            os << "name " << nameAt(i) << '\n';
        }
        if( type() != AVRO_SYMBOLIC && leafAttributes_.hasAttribute) {
            leafAt(i)->printBasicInfo(os);
        }
    }
    if(isCompound(type())) {
        os << "end " << type() << '\n';
    }
}